

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O3

void __thiscall Vault::JwtStrategy::~JwtStrategy(JwtStrategy *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_AuthenticationStrategy)._vptr_AuthenticationStrategy =
       (_func_int **)&PTR__JwtStrategy_001c2518;
  pcVar1 = (this->mount_).value_._M_dataplus._M_p;
  paVar2 = &(this->mount_).value_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  if (*(undefined1 **)&this->jwt_ != &this->field_0x38) {
    operator_delete(*(undefined1 **)&this->jwt_,*(long *)&this->field_0x38 + 1);
  }
  pcVar1 = (this->role_).value_._M_dataplus._M_p;
  paVar2 = &(this->role_).value_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

JwtStrategy(RoleId role, Jwt jwt)
    : role_(std::move(role))
    , jwt_(std::move(jwt))
    , mount_(Path{"jwt"})
  {}